

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall
node::anon_unknown_2::ChainImpl::findFirstBlockWithTimeAndHeight
          (ChainImpl *this,int64_t min_time,int min_height,FoundBlock *block)

{
  bool bVar1;
  ChainstateManager *pCVar2;
  Chainstate *pCVar3;
  CBlockIndex *index;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> lock;
  unique_lock<std::recursive_mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_40,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
             ,0x255,false);
  pCVar2 = chainman(this);
  pCVar3 = ChainstateManager::ActiveChainstate(pCVar2);
  index = CChain::FindEarliestAtLeast(&pCVar3->m_chain,min_time,min_height);
  pCVar2 = chainman(this);
  bVar1 = FillBlock(index,block,(UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_40,
                    &pCVar3->m_chain,&pCVar2->m_blockman);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool findFirstBlockWithTimeAndHeight(int64_t min_time, int min_height, const FoundBlock& block) override
    {
        WAIT_LOCK(cs_main, lock);
        const CChain& active = chainman().ActiveChain();
        return FillBlock(active.FindEarliestAtLeast(min_time, min_height), block, lock, active, chainman().m_blockman);
    }